

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

XmlAttributePtr __thiscall libcellml::XmlNode::firstAttribute(XmlNode *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlAttributePtr XVar1;
  xmlAttrPtr attribute;
  undefined1 local_29;
  xmlAttrPtr local_28;
  XmlNode local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_28 = *(xmlAttrPtr *)(*(long *)*in_RSI + 0x58);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (local_28 != (xmlAttrPtr)0x0) {
    local_20.mPimpl = (XmlNodeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlAttribute,std::allocator<libcellml::XmlAttribute>>
              (&local_18,(XmlAttribute **)&local_20,(allocator<libcellml::XmlAttribute> *)&local_29)
    ;
    this->mPimpl = (XmlNodeImpl *)local_20;
    this[1].mPimpl = (XmlNodeImpl *)local_18._M_pi;
    XmlAttribute::setXmlAttribute((XmlAttribute *)local_20.mPimpl,&local_28);
    in_RDX._M_pi = extraout_RDX;
  }
  XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlAttributePtr)
         XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlNode::firstAttribute() const
{
    xmlAttrPtr attribute = mPimpl->mXmlNodePtr->properties;
    XmlAttributePtr attributeHandle = nullptr;
    if (attribute != nullptr) {
        attributeHandle = std::make_shared<XmlAttribute>();
        attributeHandle->setXmlAttribute(attribute);
    }
    return attributeHandle;
}